

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorTables::FileDescriptorTables(FileDescriptorTables *this)

{
  FileDescriptorTables *this_local;
  
  absl::lts_20250127::
  flat_hash_set<google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  ::flat_hash_set(&this->symbols_by_parent_);
  absl::lts_20250127::once_flag::once_flag(&this->fields_by_lowercase_name_once_);
  absl::lts_20250127::once_flag::once_flag(&this->fields_by_camelcase_name_once_);
  (this->fields_by_lowercase_name_)._M_b._M_p = (__pointer_type)0x0;
  (this->fields_by_camelcase_name_)._M_b._M_p = (__pointer_type)0x0;
  absl::lts_20250127::
  flat_hash_set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::flat_hash_set(&this->fields_by_number_);
  absl::lts_20250127::
  flat_hash_set<const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ::flat_hash_set(&this->enum_values_by_number_);
  absl::lts_20250127::
  flat_hash_set<const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ::flat_hash_set(&this->unknown_enum_values_by_number_);
  absl::lts_20250127::once_flag::once_flag(&this->locations_by_path_once_);
  absl::lts_20250127::
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
  ::flat_hash_map(&this->locations_by_path_);
  absl::lts_20250127::Mutex::Mutex(&this->unknown_enum_values_mu_);
  return;
}

Assistant:

FileDescriptorTables::FileDescriptorTables() = default;